

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecFlt.h
# Opt level: O0

void Vec_FltPush(Vec_Flt_t *p,float Entry)

{
  int iVar1;
  float Entry_local;
  Vec_Flt_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_FltGrow(p,0x10);
    }
    else {
      Vec_FltGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

static inline void Vec_FltPush( Vec_Flt_t * p, float Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_FltGrow( p, 16 );
        else
            Vec_FltGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}